

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# QPDFPageObjectHelper.cc
# Opt level: O2

void __thiscall QPDFPageObjectHelper::pipeContents(QPDFPageObjectHelper *this,Pipeline *p)

{
  bool bVar1;
  BaseHandle *pBVar2;
  __shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2> local_30;
  
  pBVar2 = &(this->super_QPDFObjectHelper).super_BaseHandle;
  std::__shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr
            (&local_30,(__shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2> *)pBVar2);
  bVar1 = QPDFObjectHandle::isFormXObject((QPDFObjectHandle *)&local_30);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_30._M_refcount);
  if (bVar1) {
    std::__shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr
              (&local_30,(__shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2> *)pBVar2);
    QPDFObjectHandle::pipeStreamData
              ((QPDFObjectHandle *)&local_30,p,0,qpdf_dl_specialized,false,false);
  }
  else {
    std::__shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr
              (&local_30,(__shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2> *)pBVar2);
    QPDFObjectHandle::pipePageContents((QPDFObjectHandle *)&local_30,p);
  }
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_30._M_refcount);
  return;
}

Assistant:

void
QPDFPageObjectHelper::pipeContents(Pipeline* p)
{
    if (oh().isFormXObject()) {
        oh().pipeStreamData(p, 0, qpdf_dl_specialized);
    } else {
        oh().pipePageContents(p);
    }
}